

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

bool CheckTxScripts(CTransaction *tx,
                   map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                   *map_prevout_scriptPubKeys,
                   map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *map_prevout_values,uint flags,PrecomputedTransactionData *txdata,string *strTest
                   ,bool expect_valid)

{
  pointer pCVar1;
  ulong uVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  mapped_type *scriptPubKey;
  ulong uVar5;
  uint uVar6;
  iterator pvVar7;
  PrecomputedTransactionData *checker;
  iterator pvVar8;
  string *serror;
  pointer pCVar9;
  string *psVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  ScriptError err;
  check_type cVar11;
  bool local_231;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  assertion_result local_130 [2];
  undefined1 local_f4 [4];
  string local_f0;
  undefined1 local_d0 [8];
  element_type *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  PrecomputedTransactionData *local_b0;
  undefined1 local_a8 [24];
  string *psStack_90;
  uint32_t local_88;
  direct_or_indirect local_80;
  uint local_64;
  uint32_t local_60;
  CScriptWitness local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f4 = (undefined1  [4])(uint)expect_valid;
  pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish == pCVar9) {
    local_231 = true;
    checker = txdata;
    serror = strTest;
  }
  else {
    uVar6 = 1;
    uVar2 = 0;
    do {
      pCVar1 = pCVar9 + uVar2;
      local_88 = (pCVar1->prevout).n;
      local_a8._0_8_ =
           *(undefined8 *)(pCVar1->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_a8._8_8_ =
           *(undefined8 *)
            ((pCVar1->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_a8._16_8_ =
           *(undefined8 *)
            ((pCVar1->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      psStack_90 = *(string **)
                    ((pCVar1->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents,
                 &(pCVar1->scriptSig).super_CScriptBase);
      local_60 = pCVar1->nSequence;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector(&local_58.stack,&pCVar9[uVar2].scriptWitness.stack);
      cVar3 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              ::find(&map_prevout_values->_M_t,(key_type *)local_a8);
      if ((_Rb_tree_header *)cVar3._M_node ==
          &(map_prevout_values->_M_t)._M_impl.super__Rb_tree_header) {
        psVar10 = (string *)0x0;
      }
      else {
        pmVar4 = std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::at(map_prevout_values,(key_type *)local_a8);
        psVar10 = (string *)*pmVar4;
      }
      scriptPubKey = std::
                     map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                     ::at(map_prevout_scriptPubKeys,(key_type *)local_a8);
      local_d0 = (undefined1  [8])&PTR_CheckECDSASignature_0138d8a0;
      aStack_c0._M_allocated_capacity = (ulong)(uVar6 - 1) << 0x20;
      checker = (PrecomputedTransactionData *)local_d0;
      serror = (string *)local_f4;
      local_c8 = (element_type *)tx;
      aStack_c0._8_8_ = psVar10;
      local_b0 = txdata;
      local_231 = VerifyScript((CScript *)&local_80.indirect_contents,scriptPubKey,&local_58,flags,
                               (BaseSignatureChecker *)checker,(ScriptError *)serror);
      if (expect_valid) {
        local_150 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x88;
        file.m_begin = (iterator)&local_150;
        msg.m_end = (iterator)serror;
        msg.m_begin = (iterator)checker;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,
                   msg);
        local_f0._M_string_length = 0;
        local_f0.field_2._0_8_ = 0;
        local_c8 = (element_type *)((ulong)local_c8 & 0xffffffffffffff00);
        local_d0 = (undefined1  [8])&PTR__lazy_ostream_01388e08;
        aStack_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_170 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
        ;
        local_168 = "";
        pvVar7 = (iterator)0x1;
        pvVar8 = (iterator)0x1;
        local_f0._M_dataplus._M_p._0_1_ = local_231;
        aStack_c0._8_8_ = strTest;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)(local_f4 + 4),(lazy_ostream *)local_d0,1,1,WARN,_cVar11,
                   (size_t)&local_170,0x88);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_f0.field_2._M_allocated_capacity);
        local_180 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x89;
        file_00.m_begin = (iterator)&local_180;
        msg_00.m_end = pvVar8;
        msg_00.m_begin = pvVar7;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190
                   ,msg_00);
        local_130[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
        value = (readonly_property<bool>)(local_f4 == (undefined1  [4])0x0);
        local_130[0].m_message.px = (element_type *)0x0;
        local_130[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
        ScriptErrorString_abi_cxx11_((string *)(local_f4 + 4),(ScriptError)local_f4);
        local_c8 = (element_type *)((ulong)local_c8 & 0xffffffffffffff00);
        local_d0 = (undefined1  [8])&PTR__lazy_ostream_01388e08;
        aStack_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_1a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
        ;
        local_198 = "";
        checker = (PrecomputedTransactionData *)0x1;
        serror = (string *)0x1;
        aStack_c0._8_8_ = (string *)(local_f4 + 4);
        boost::test_tools::tt_detail::report_assertion
                  (local_130,(lazy_ostream *)local_d0,1,1,WARN,_cVar11,(size_t)&local_1a0,0x89);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
            &local_f0.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                      local_f0._M_dataplus._M_p._0_1_),local_f0.field_2._0_8_ + 1);
        }
        boost::detail::shared_count::~shared_count(&local_130[0].m_message.pn);
        local_f4 = (undefined1  [4])0x1;
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_58.stack);
      if (0x1c < local_64) {
        free(local_80.indirect_contents.indirect);
      }
      uVar2 = (ulong)uVar6;
      pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar9 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while ((uVar2 <= uVar5 && uVar5 - uVar2 != 0) && (uVar6 = uVar6 + 1, local_231));
  }
  if (!expect_valid) {
    local_1b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1a8 = "";
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x8e;
    file_01.m_begin = (iterator)&local_1b0;
    msg_01.m_end = (iterator)serror;
    msg_01.m_begin = (iterator)checker;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c0,
               msg_01);
    local_d0 = (undefined1  [8])(CONCAT71(local_d0._1_7_,~local_231) & 0xffffffffffffff01);
    local_c8 = (element_type *)0x0;
    aStack_c0._M_allocated_capacity = 0;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8._0_8_ = &PTR__lazy_ostream_01388e08;
    local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1c8 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x1;
    psStack_90 = strTest;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d0,(lazy_ostream *)local_a8,1,1,WARN,_cVar11,
               (size_t)&local_1d0,0x8e);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_c0);
    local_1e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x8f;
    file_02.m_begin = (iterator)&local_1e0;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
               msg_02);
    local_f0._M_dataplus._M_p._0_1_ = local_f4 != (undefined1  [4])0x0;
    local_f0._M_string_length = 0;
    local_f0.field_2._0_8_ = 0;
    ScriptErrorString_abi_cxx11_((string *)local_d0,(ScriptError)local_f4);
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8._0_8_ = &PTR__lazy_ostream_01388e08;
    local_a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1f8 = "";
    psStack_90 = (string *)local_d0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_f4 + 4),(lazy_ostream *)local_a8,1,1,WARN,_cVar11,
               (size_t)&local_200,0x8f);
    if (local_d0 != (undefined1  [8])&aStack_c0) {
      operator_delete((void *)local_d0,(ulong)(aStack_c0._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_f0.field_2._M_allocated_capacity);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)((local_231 ^ expect_valid ^ 1U) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CheckTxScripts(const CTransaction& tx, const std::map<COutPoint, CScript>& map_prevout_scriptPubKeys,
    const std::map<COutPoint, int64_t>& map_prevout_values, unsigned int flags,
    const PrecomputedTransactionData& txdata, const std::string& strTest, bool expect_valid)
{
    bool tx_valid = true;
    ScriptError err = expect_valid ? SCRIPT_ERR_UNKNOWN_ERROR : SCRIPT_ERR_OK;
    for (unsigned int i = 0; i < tx.vin.size() && tx_valid; ++i) {
        const CTxIn input = tx.vin[i];
        const CAmount amount = map_prevout_values.count(input.prevout) ? map_prevout_values.at(input.prevout) : 0;
        try {
            tx_valid = VerifyScript(input.scriptSig, map_prevout_scriptPubKeys.at(input.prevout),
                &input.scriptWitness, flags, TransactionSignatureChecker(&tx, i, amount, txdata, MissingDataBehavior::ASSERT_FAIL), &err);
        } catch (...) {
            BOOST_ERROR("Bad test: " << strTest);
            return true; // The test format is bad and an error is thrown. Return true to silence further error.
        }
        if (expect_valid) {
            BOOST_CHECK_MESSAGE(tx_valid, strTest);
            BOOST_CHECK_MESSAGE((err == SCRIPT_ERR_OK), ScriptErrorString(err));
            err = SCRIPT_ERR_UNKNOWN_ERROR;
        }
    }
    if (!expect_valid) {
        BOOST_CHECK_MESSAGE(!tx_valid, strTest);
        BOOST_CHECK_MESSAGE((err != SCRIPT_ERR_OK), ScriptErrorString(err));
    }
    return (tx_valid == expect_valid);
}